

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O3

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryClonePrimitive
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  StreamWriter *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  JavascriptBoolean *pJVar5;
  JavascriptTypedNumber<long> *pJVar6;
  JavascriptTypedNumber<unsigned_long> *pJVar7;
  char *message;
  char *error;
  uint lineNumber;
  undefined8 local_28;
  
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  switch(typeId) {
  case TypeIds_Undefined:
    local_28 = (double)CONCAT44(local_28._4_4_,3);
    goto LAB_00f0e1a8;
  case TypeIds_Null:
    local_28 = (double)CONCAT44(local_28._4_4_,2);
    goto LAB_00f0e1a8;
  case TypeIds_Boolean:
    pJVar5 = VarTo<Js::JavascriptBoolean>(src);
    local_28 = (double)CONCAT44(local_28._4_4_,(pJVar5->value == 0) + 4);
LAB_00f0e1a8:
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
    break;
  case TypeIds_FirstNumberType:
    local_28 = (double)CONCAT44(local_28._4_4_,6);
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
    pSVar1 = this->m_writer;
    if (((ulong)src & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)src & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)src & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        error = "(Is(aValue))";
        message = "Ensure var is actually a \'TaggedInt\'";
        lineNumber = 0x43;
        goto LAB_00f0e26f;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00f0e26f:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Language/TaggedInt.inl"
                                  ,lineNumber,error,message);
      if (!bVar3) {
LAB_00f0e29a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    local_28 = (double)CONCAT44(local_28._4_4_,(int)src);
    StreamWriter::Write<int>(pSVar1,(int *)&local_28);
    break;
  case TypeIds_Number:
    local_28 = (double)CONCAT44(local_28._4_4_,7);
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
    pSVar1 = this->m_writer;
    if ((ulong)src >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/../Runtime/Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00f0e29a;
      *puVar4 = 0;
    }
    local_28 = (double)((ulong)src ^ 0xfffc000000000000);
    StreamWriter::Write<double>(pSVar1,(double *)&local_28);
    break;
  case TypeIds_Int64Number:
    local_28 = (double)CONCAT44(local_28._4_4_,9);
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
    pSVar1 = this->m_writer;
    pJVar6 = VarTo<Js::JavascriptTypedNumber<long>>(src);
    local_28 = (double)pJVar6->m_value;
    StreamWriter::Write<long>(pSVar1,&local_28);
    break;
  case TypeIds_LastNumberType:
    local_28 = (double)CONCAT44(local_28._4_4_,10);
    StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)&local_28);
    pSVar1 = this->m_writer;
    pJVar7 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(src);
    local_28 = (double)pJVar7->m_value;
    StreamWriter::Write<unsigned_long>(pSVar1,&local_28);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        switch (typeId)
        {
        case TypeIds_Undefined:
            WriteTypeId(SCA_UndefinedValue);
            break;

        case TypeIds_Null:
            WriteTypeId(SCA_NullValue);
            break;

        case TypeIds_Boolean:
            WriteTypeId(
                VarTo<JavascriptBoolean>(src)->GetValue() ? SCA_TrueValue : SCA_FalseValue);
            break;

        case TypeIds_Integer:
            {
                WriteTypeId(SCA_Int32Value);
                m_writer->Write(TaggedInt::ToInt32(src));
            }
            break;

        case TypeIds_Number:
            {
                WriteTypeId(SCA_DoubleValue);
                m_writer->Write(JavascriptNumber::GetValue(src));
            }
            break;

        case TypeIds_Int64Number:
            {
                WriteTypeId(SCA_Int64Value);
                m_writer->Write(VarTo<JavascriptInt64Number>(src)->GetValue());
            }
            break;

        case TypeIds_UInt64Number:
            {
                WriteTypeId(SCA_Uint64Value);
                m_writer->Write(VarTo<JavascriptUInt64Number>(src)->GetValue());
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }